

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

Address * __thiscall
cfd::TransactionContext::GetTxOutAddress
          (Address *__return_storage_ptr__,TransactionContext *this,uint32_t index,NetType net_type)

{
  long lVar1;
  CfdException *this_00;
  Script local_80;
  AddressFactory address_factory;
  
  lVar1 = (long)(this->super_Transaction).vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_Transaction).vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((ulong)index < (ulong)(lVar1 / 0x50)) {
    AddressFactory::AddressFactory(&address_factory,net_type);
    core::AbstractTxOut::GetLockingScript
              (&local_80,
               &(this->super_Transaction).vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_start[index].super_AbstractTxOut);
    AddressFactory::GetAddressByLockingScript(__return_storage_ptr__,&address_factory,&local_80);
    core::Script::~Script(&local_80);
    AddressFactory::~AddressFactory(&address_factory);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30,0x50,lVar1 % 0x50);
  std::__cxx11::string::string
            ((string *)&local_80,"vout out_of_range error.",(allocator *)&address_factory);
  core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&local_80);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Address TransactionContext::GetTxOutAddress(
    uint32_t index, NetType net_type) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  AddressFactory address_factory(net_type);
  return address_factory.GetAddressByLockingScript(
      vout_[index].GetLockingScript());
}